

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBatchTestHandler.cxx
# Opt level: O1

void __thiscall cmCTestBatchTestHandler::WriteBatchScript(cmCTestBatchTestHandler *this)

{
  _Rb_tree_header *p_Var1;
  long *plVar2;
  _Base_ptr p_Var3;
  _func_int **pp_Var4;
  ofstream fout;
  string local_248;
  undefined1 local_228 [8];
  long local_220;
  _func_int *local_218;
  long lStack_210;
  ios_base local_130 [264];
  
  cmCTest::GetBinaryDir_abi_cxx11_(&local_248,(this->super_cmCTestMultiProcessHandler).CTest);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_248);
  pp_Var4 = (_func_int **)(plVar2 + 2);
  if ((_func_int **)*plVar2 == pp_Var4) {
    local_218 = *pp_Var4;
    lStack_210 = plVar2[3];
    local_228 = (undefined1  [8])&local_218;
  }
  else {
    local_218 = *pp_Var4;
    local_228 = (undefined1  [8])*plVar2;
  }
  local_220 = plVar2[1];
  *plVar2 = (long)pp_Var4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->Script,(string *)local_228);
  if (local_228 != (undefined1  [8])&local_218) {
    operator_delete((void *)local_228,(ulong)(local_218 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  std::ofstream::ofstream(local_228);
  std::ofstream::open(local_228,(_Ios_Openmode)(this->Script)._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"#!/bin/sh\n",10);
  p_Var3 = *(_Base_ptr *)
            ((long)&(this->super_cmCTestMultiProcessHandler).Tests.
                    super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                    ._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  p_Var1 = &(this->super_cmCTestMultiProcessHandler).Tests.
            super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    do {
      WriteSrunArgs(this,p_Var3[1]._M_color,(ostream *)local_228);
      WriteTestCommand(this,p_Var3[1]._M_color,(ostream *)local_228);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"\n",1);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  std::ostream::flush();
  std::ofstream::close();
  local_228 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_228 + (long)_VTT[-3]) = _vtable;
  std::filebuf::~filebuf((filebuf *)&local_220);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void cmCTestBatchTestHandler::WriteBatchScript()
{
  this->Script = this->CTest->GetBinaryDir() + "/Testing/CTestBatch.txt";
  cmsys::ofstream fout;
  fout.open(this->Script.c_str());
  fout << "#!/bin/sh\n";

  for (TestMap::iterator i = this->Tests.begin(); i != this->Tests.end();
       ++i) {
    this->WriteSrunArgs(i->first, fout);
    this->WriteTestCommand(i->first, fout);
    fout << "\n";
  }
  fout.flush();
  fout.close();
}